

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentRecord.cpp
# Opt level: O0

EnvironmentRecordPtr *
KDIS::DATA_TYPE::EnvironmentRecord::FactoryDecodeEnvironmentRecord
          (EnvironmentRecordPtr *__return_storage_ptr__,KDataStream *stream)

{
  PointRecord1 *this;
  PointRecord2 *this_00;
  LineRecord1 *this_01;
  LineRecord2 *this_02;
  BoundingSphereRecord *this_03;
  EnvironmentRecord *p;
  SphereRecord2 *this_04;
  EllipsoidRecord1 *this_05;
  EllipsoidRecord2 *this_06;
  ConeRecord1 *this_07;
  ConeRecord2 *this_08;
  RectangularVolumeRecord1 *this_09;
  RectangularVolumeRecord2 *this_10;
  GaussianPlumeRecord *this_11;
  GaussianPuffRecord *this_12;
  RectangularVolumeRecord3 *this_13;
  COMBICState *this_14;
  FlareState *this_15;
  KException *pKVar1;
  allocator<char> local_81;
  KString local_80;
  undefined1 local_5a;
  allocator<char> local_59;
  KString local_58;
  EnvironmentRecord *local_28;
  EnvironmentRecord *pRec;
  KUINT32 ui32RecType;
  KUINT16 ui16CurrentWritePos;
  KDataStream *stream_local;
  
  _ui32RecType = stream;
  stream_local = (KDataStream *)__return_storage_ptr__;
  pRec._6_2_ = KDataStream::GetCurrentWritePosition(stream);
  KDataStream::operator>>(_ui32RecType,(uint *)&pRec);
  KDataStream::SetCurrentWritePosition(_ui32RecType,pRec._6_2_);
  local_28 = FactoryDecoderUser<KDIS::DATA_TYPE::EnvironmentRecord>::FactoryDecode
                       ((uint)pRec,_ui32RecType);
  if (local_28 == (EnvironmentRecord *)0x0) {
    if ((uint)pRec == 0x100) {
      this_14 = (COMBICState *)operator_new(0x68);
      COMBICState::COMBICState(this_14,_ui32RecType);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                (__return_storage_ptr__,(EnvironmentRecord *)this_14);
    }
    else if ((uint)pRec == 0x103) {
      this_15 = (FlareState *)operator_new(0x38);
      FlareState::FlareState(this_15,_ui32RecType);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                (__return_storage_ptr__,(EnvironmentRecord *)this_15);
    }
    else if ((uint)pRec == 0x10000) {
      this_03 = (BoundingSphereRecord *)operator_new(0x38);
      BoundingSphereRecord::BoundingSphereRecord(this_03,_ui32RecType);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                (__return_storage_ptr__,(EnvironmentRecord *)this_03);
    }
    else {
      if ((uint)pRec == 0x50000) {
        local_5a = 1;
        pKVar1 = (KException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"FactoryDecodeEnvironmentRecord",&local_59);
        KException::KException<char_const*>(pKVar1,&local_58,9,"UniformGeometryRecordType");
        local_5a = 0;
        __cxa_throw(pKVar1,&KException::typeinfo,KException::~KException);
      }
      if ((uint)pRec == 0xa0000) {
        this = (PointRecord1 *)operator_new(0x30);
        PointRecord1::PointRecord1(this,_ui32RecType);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                  (__return_storage_ptr__,(EnvironmentRecord *)this);
      }
      else if ((uint)pRec == 0xc0000) {
        this_01 = (LineRecord1 *)operator_new(0x50);
        LineRecord1::LineRecord1(this_01,_ui32RecType);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                  (__return_storage_ptr__,(EnvironmentRecord *)this_01);
      }
      else if ((uint)pRec == 0xd0000) {
        p = (EnvironmentRecord *)operator_new(0x38);
        SphereRecord1::SphereRecord1((SphereRecord1 *)p,_ui32RecType);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr(__return_storage_ptr__,p);
      }
      else if ((uint)pRec == 0x100000) {
        this_05 = (EllipsoidRecord1 *)operator_new(0x60);
        EllipsoidRecord1::EllipsoidRecord1(this_05,_ui32RecType);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                  (__return_storage_ptr__,(EnvironmentRecord *)this_05);
      }
      else if ((uint)pRec == 0x300000) {
        this_07 = (ConeRecord1 *)operator_new(0x58);
        ConeRecord1::ConeRecord1(this_07,_ui32RecType);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                  (__return_storage_ptr__,(EnvironmentRecord *)this_07);
      }
      else if ((uint)pRec == 0x500000) {
        this_09 = (RectangularVolumeRecord1 *)operator_new(0x60);
        RectangularVolumeRecord1::RectangularVolumeRecord1(this_09,_ui32RecType);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                  (__return_storage_ptr__,(EnvironmentRecord *)this_09);
      }
      else if ((uint)pRec == 0x5000000) {
        this_13 = (RectangularVolumeRecord3 *)operator_new(0x60);
        RectangularVolumeRecord3::RectangularVolumeRecord3(this_13,_ui32RecType);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                  (__return_storage_ptr__,(EnvironmentRecord *)this_13);
      }
      else if ((uint)pRec == 0xa000000) {
        this_00 = (PointRecord2 *)operator_new(0x50);
        PointRecord2::PointRecord2(this_00,_ui32RecType);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                  (__return_storage_ptr__,(EnvironmentRecord *)this_00);
      }
      else if ((uint)pRec == 0xc000000) {
        this_02 = (LineRecord2 *)operator_new(0x80);
        LineRecord2::LineRecord2(this_02,_ui32RecType);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                  (__return_storage_ptr__,(EnvironmentRecord *)this_02);
      }
      else if ((uint)pRec == 0xd000000) {
        this_04 = (SphereRecord2 *)operator_new(0x70);
        SphereRecord2::SphereRecord2(this_04,_ui32RecType);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                  (__return_storage_ptr__,(EnvironmentRecord *)this_04);
      }
      else if ((uint)pRec == 0x10000000) {
        this_06 = (EllipsoidRecord2 *)operator_new(0xb0);
        EllipsoidRecord2::EllipsoidRecord2(this_06,_ui32RecType);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                  (__return_storage_ptr__,(EnvironmentRecord *)this_06);
      }
      else if ((uint)pRec == 0x30000000) {
        this_08 = (ConeRecord2 *)operator_new(0x90);
        ConeRecord2::ConeRecord2(this_08,_ui32RecType);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                  (__return_storage_ptr__,(EnvironmentRecord *)this_08);
      }
      else if ((uint)pRec == 0x50000000) {
        this_10 = (RectangularVolumeRecord2 *)operator_new(0xb0);
        RectangularVolumeRecord2::RectangularVolumeRecord2(this_10,_ui32RecType);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                  (__return_storage_ptr__,(EnvironmentRecord *)this_10);
      }
      else if ((uint)pRec == 0x60000000) {
        this_11 = (GaussianPlumeRecord *)operator_new(0xa0);
        GaussianPlumeRecord::GaussianPlumeRecord(this_11,_ui32RecType);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                  (__return_storage_ptr__,(EnvironmentRecord *)this_11);
      }
      else {
        if ((uint)pRec != 0x70000000) {
          pKVar1 = (KException *)__cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"FactoryDecodeEnvironmentRecord",&local_81);
          KException::KException<unsigned_int>(pKVar1,&local_80,9,(uint)pRec);
          __cxa_throw(pKVar1,&KException::typeinfo,KException::~KException);
        }
        this_12 = (GaussianPuffRecord *)operator_new(0xd0);
        GaussianPuffRecord::GaussianPuffRecord(this_12,_ui32RecType);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
                  (__return_storage_ptr__,(EnvironmentRecord *)this_12);
      }
    }
  }
  else {
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr(__return_storage_ptr__,local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

EnvironmentRecordPtr EnvironmentRecord::FactoryDecodeEnvironmentRecord(KDataStream &stream) noexcept(false)
{
    // We now need to "peak" at the next 4 bytes to determine the Environment Record type,
    // once we have determined the type we need to return the buffers write positon as this
    // field needs to be re-read by the decode function of the derived Environment Record.
    KUINT16 ui16CurrentWritePos = stream.GetCurrentWritePosition();

    KUINT32 ui32RecType;
    stream >> ui32RecType;

    // We now know what type of record we should create, we need to reset the buffer so this value can be re-read.
    stream.SetCurrentWritePosition( ui16CurrentWritePos );

	// Check for a custom decoder, if none if found then use one of our standard data types.
	EnvironmentRecord * pRec = FactoryDecode( ui32RecType, stream );
	if( pRec )
	{
		return EnvironmentRecordPtr( pRec );
	}

    switch( ui32RecType )
    {
		//
		// Geometry Records
		//
		case PointRecord1Type:                  return new PointRecord1( stream );
		case PointRecord2Type:                  return new PointRecord2( stream );
		case LineRecord1Type:                   return new LineRecord1( stream );
		case LineRecord2Type:                   return new LineRecord2( stream );
		case BoundingSphereRecordType:          return new BoundingSphereRecord( stream );
		case SphereRecord1Type:                 return new SphereRecord1( stream );
		case SphereRecord2Type:                 return new SphereRecord2( stream );
		case EllipsoidRecord1Type:              return new EllipsoidRecord1( stream );
		case EllipsoidRecord2Type:              return new EllipsoidRecord2( stream );
		case ConeRecord1Type:                   return new ConeRecord1( stream );
		case ConeRecord2Type:                   return new ConeRecord2( stream );
		case UniformGeometryRecordType:         throw KException( __FUNCTION__, UNSUPPORTED_DATATYPE, "UniformGeometryRecordType" ); // We don't know how to decode this type.	    
		case RectangularVolumeRecord1Type:      return new RectangularVolumeRecord1( stream );
		case RectangularVolumeRecord2Type:      return new RectangularVolumeRecord2( stream );
		case GaussianPlumeRecordType:           return new GaussianPlumeRecord( stream );
		case GaussianPuffRecordType:            return new GaussianPuffRecord( stream );
		case RectangularVolumeRecord3Type:      return new RectangularVolumeRecord3( stream );

		//
		// State Records
		//
		case COMBICStateType:                   return new COMBICState( stream );
		case FlareStateType:                    return new FlareState( stream );
		default:                                throw KException( __FUNCTION__, UNSUPPORTED_DATATYPE, ui32RecType ); // We don't know how to decode this type.
    }    
}